

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1373::~TestCase1373(TestCase1373 *this)

{
  TestCase1373 *this_local;
  
  kj::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

TEST(Orphans, ExtendPointerListCopy) {
  MallocMessageBuilder message;

  // Allocate data in advance so that the list itself is at the end of the segment.
  kj::Vector<Orphan<Text>> pointers(7);
  for (uint i = 0; i < 7; i++) {
    pointers.add(message.getOrphanage().newOrphanCopy(Text::Reader(kj::str("foo", i))));
  }

  auto orphan = message.getOrphanage().newOrphan<List<Text>>(7);
  auto builder = orphan.get();
  for (uint i = 0; i < 7; i++) {
    builder.adopt(i, kj::mv(pointers[i]));
  }

  auto orphan2 = message.getOrphanage().newOrphan<Data>(1);
  orphan2.get()[0] = 32;

  orphan.truncate(11);

  auto reader = orphan.getReader();
  EXPECT_EQ(11, reader.size());

  for (uint i = 0; i < 7; i++) {
    EXPECT_EQ(kj::str("foo", i), reader[i]);
    EXPECT_TRUE(builder[i] == nullptr);
  }
  for (uint i = 7; i < 11; i++) {
    EXPECT_TRUE(reader[i] == nullptr);
  }

  // Can't compare pointers directly, but we can check if builder modifications are visible using
  // the reader.
  builder.set(0, "bar");
  EXPECT_EQ("foo0", reader[0]);

  EXPECT_EQ(32, orphan2.getReader()[0]);
}